

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void prvTidyCleanDocument(TidyDocImpl *doc)

{
  Lexer *lexer;
  Lexer *lexer_00;
  Node *pNVar1;
  AttVal *pAVar2;
  tmbstr ptVar3;
  Node *pNVar4;
  TagStyle *pTVar5;
  ctmbstr local_40;
  ctmbstr local_38;
  
  CleanTree(doc,&doc->root);
  if (*(int *)((doc->config).value + 0x30) != 0) {
    DefineStyleRules(doc,&doc->root);
    lexer = doc->lexer;
    if (lexer->styles == (TagStyle *)0x0) {
      pNVar1 = prvTidyFindBody(doc);
      if (pNVar1 == (Node *)0x0) {
        return;
      }
      pAVar2 = prvTidyAttrGetById(pNVar1,TidyAttr_BACKGROUND);
      if (((((pAVar2 == (AttVal *)0x0) &&
            (pAVar2 = prvTidyAttrGetById(pNVar1,TidyAttr_BGCOLOR), pAVar2 == (AttVal *)0x0)) &&
           (pAVar2 = prvTidyAttrGetById(pNVar1,TidyAttr_TEXT), pAVar2 == (AttVal *)0x0)) &&
          ((pAVar2 = prvTidyAttrGetById(pNVar1,TidyAttr_LINK), pAVar2 == (AttVal *)0x0 &&
           (pAVar2 = prvTidyAttrGetById(pNVar1,TidyAttr_VLINK), pAVar2 == (AttVal *)0x0)))) &&
         (pAVar2 = prvTidyAttrGetById(pNVar1,TidyAttr_ALINK), pAVar2 == (AttVal *)0x0)) {
        return;
      }
      *(byte *)&doc->badLayout = (byte)doc->badLayout | 0x10;
    }
    pNVar1 = prvTidyNewNode(doc->allocator,lexer);
    pNVar1->type = StartTag;
    pNVar1->implicit = yes;
    ptVar3 = prvTidytmbstrdup(doc->allocator,"style");
    pNVar1->element = ptVar3;
    prvTidyFindTag(doc,pNVar1);
    pAVar2 = prvTidyNewAttributeEx(doc,"type","text/css",0x22);
    prvTidyInsertAttributeAtStart(pNVar1,pAVar2);
    pNVar4 = prvTidyFindBody(doc);
    lexer->txtstart = lexer->lexsize;
    if (pNVar4 != (Node *)0x0) {
      lexer_00 = doc->lexer;
      pAVar2 = prvTidyAttrGetById(pNVar4,TidyAttr_BACKGROUND);
      if (pAVar2 == (AttVal *)0x0) {
        ptVar3 = (ctmbstr)0x0;
      }
      else {
        ptVar3 = pAVar2->value;
        pAVar2->value = (tmbstr)0x0;
        prvTidyRemoveAttribute(doc,pNVar4,pAVar2);
      }
      pAVar2 = prvTidyAttrGetById(pNVar4,TidyAttr_BGCOLOR);
      if (pAVar2 == (AttVal *)0x0) {
        local_38 = (ctmbstr)0x0;
      }
      else {
        local_38 = pAVar2->value;
        pAVar2->value = (tmbstr)0x0;
        prvTidyRemoveAttribute(doc,pNVar4,pAVar2);
      }
      pAVar2 = prvTidyAttrGetById(pNVar4,TidyAttr_TEXT);
      if (pAVar2 == (AttVal *)0x0) {
        local_40 = (ctmbstr)0x0;
      }
      else {
        local_40 = pAVar2->value;
        pAVar2->value = (tmbstr)0x0;
        prvTidyRemoveAttribute(doc,pNVar4,pAVar2);
      }
      if (((ptVar3 != (ctmbstr)0x0) || (local_38 != (ctmbstr)0x0)) || (local_40 != (ctmbstr)0x0)) {
        prvTidyAddStringLiteral(lexer_00," body {\n");
        if (ptVar3 != (ctmbstr)0x0) {
          prvTidyAddStringLiteral(lexer_00,"  background-image: url(");
          prvTidyAddStringLiteral(lexer_00,ptVar3);
          prvTidyAddStringLiteral(lexer_00,");\n");
          (*doc->allocator->vtbl->free)(doc->allocator,ptVar3);
        }
        if (local_38 != (ctmbstr)0x0) {
          prvTidyAddStringLiteral(lexer_00,"  background-color: ");
          prvTidyAddStringLiteral(lexer_00,local_38);
          prvTidyAddStringLiteral(lexer_00,";\n");
          (*doc->allocator->vtbl->free)(doc->allocator,local_38);
        }
        if (local_40 != (ctmbstr)0x0) {
          prvTidyAddStringLiteral(lexer_00,"  color: ");
          prvTidyAddStringLiteral(lexer_00,local_40);
          prvTidyAddStringLiteral(lexer_00,";\n");
          (*doc->allocator->vtbl->free)(doc->allocator,local_40);
        }
        prvTidyAddStringLiteral(lexer_00," }\n");
      }
      pAVar2 = prvTidyAttrGetById(pNVar4,TidyAttr_LINK);
      if (pAVar2 != (AttVal *)0x0) {
        AddColorRule(lexer_00," :link",pAVar2->value);
        prvTidyRemoveAttribute(doc,pNVar4,pAVar2);
      }
      pAVar2 = prvTidyAttrGetById(pNVar4,TidyAttr_VLINK);
      if (pAVar2 != (AttVal *)0x0) {
        AddColorRule(lexer_00," :visited",pAVar2->value);
        prvTidyRemoveAttribute(doc,pNVar4,pAVar2);
      }
      pAVar2 = prvTidyAttrGetById(pNVar4,TidyAttr_ALINK);
      if (pAVar2 != (AttVal *)0x0) {
        AddColorRule(lexer_00," :active",pAVar2->value);
        prvTidyRemoveAttribute(doc,pNVar4,pAVar2);
      }
    }
    for (pTVar5 = lexer->styles; pTVar5 != (TagStyle *)0x0; pTVar5 = pTVar5->next) {
      prvTidyAddCharToLexer(lexer,0x20);
      prvTidyAddStringLiteral(lexer,pTVar5->tag);
      prvTidyAddCharToLexer(lexer,0x2e);
      prvTidyAddStringLiteral(lexer,pTVar5->tag_class);
      prvTidyAddCharToLexer(lexer,0x20);
      prvTidyAddCharToLexer(lexer,0x7b);
      prvTidyAddStringLiteral(lexer,pTVar5->properties);
      prvTidyAddCharToLexer(lexer,0x7d);
      prvTidyAddCharToLexer(lexer,10);
    }
    lexer->txtend = lexer->lexsize;
    pNVar4 = prvTidyTextToken(lexer);
    prvTidyInsertNodeAtEnd(pNVar1,pNVar4);
    pNVar4 = prvTidyFindHEAD(doc);
    if (pNVar4 != (Node *)0x0) {
      prvTidyInsertNodeAtEnd(pNVar4,pNVar1);
      return;
    }
  }
  return;
}

Assistant:

void TY_(CleanDocument)( TidyDocImpl* doc )
{
    /* placeholder.  CleanTree()/CleanNode() will not
    ** zap root element 
    */
    CleanTree( doc, &doc->root );

    if ( cfgBool(doc, TidyMakeClean) )
    {
        DefineStyleRules( doc, &doc->root );
        CreateStyleElement( doc );
    }
}